

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O3

Char * __thiscall Diligent::StringPool::CopyString(StringPool *this,char *Str)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  string msg;
  string local_30;
  
  if (Str == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = this->m_pCurrPtr;
    cVar1 = *Str;
    pcVar2 = pcVar3;
    if (cVar1 != '\0') {
      pcVar4 = Str + 1;
      do {
        pcVar2 = this->m_pCurrPtr;
        if (this->m_pBuffer + this->m_ReservedSize <= pcVar2) goto LAB_001e8927;
        this->m_pCurrPtr = pcVar2 + 1;
        *pcVar2 = cVar1;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
      pcVar2 = this->m_pCurrPtr;
    }
LAB_001e8927:
    if (pcVar2 < this->m_pBuffer + this->m_ReservedSize) {
      this->m_pCurrPtr = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    else {
      FormatString<char[45]>
                (&local_30,(char (*) [45])"Not enough space reserved in the string pool");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"CopyString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
                 ,0x95);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return pcVar3;
}

Assistant:

Char* CopyString(const char* Str)
    {
        if (Str == nullptr)
            return nullptr;

        auto* Ptr = m_pCurrPtr;
        while (*Str != 0 && m_pCurrPtr < m_pBuffer + m_ReservedSize)
        {
            *(m_pCurrPtr++) = *(Str++);
        }
        if (m_pCurrPtr < m_pBuffer + m_ReservedSize)
            *(m_pCurrPtr++) = 0;
        else
            UNEXPECTED("Not enough space reserved in the string pool");
        return Ptr;
    }